

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int LoadDeepEXR(DeepImage *deepImage,char *filename,char **err)

{
  pointer *ty;
  allocator<float> *this;
  unsigned_long uVar1;
  pointer __n;
  unsigned_long_long uVar2;
  undefined8 __n_00;
  bool bVar3;
  int iVar4;
  FP32 FVar5;
  FILE *__stream;
  reference pvVar6;
  size_t sVar7;
  unsigned_long_long *puVar8;
  byte *pbVar9;
  size_type sVar10;
  float ***pppfVar11;
  float **ppfVar12;
  int **ppiVar13;
  int *piVar14;
  reference pvVar15;
  reference pvVar16;
  reference pvVar17;
  reference pvVar18;
  float *pfVar19;
  uint *puVar20;
  long lVar21;
  char **ppcVar22;
  char *pcVar23;
  int local_270;
  int c_2;
  float f;
  int x_3;
  FP16 local_25c;
  FP32 f32;
  FP16 f16;
  int x_2;
  uint ui;
  int x_1;
  int c_1;
  unsigned_long_long dataOffset;
  int samplesPerLine;
  int i_1;
  int channelOffset;
  vector<int,_std::allocator<int>_> channelOffsetList;
  pointer piStack_210;
  int sampleSize;
  unsigned_long dstLen_1;
  undefined1 local_200 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> sampleData;
  unsigned_long uStack_1e0;
  int i;
  unsigned_long dstLen;
  undefined1 local_1d0 [8];
  vector<int,_std::allocator<int>_> pixelOffsetTable;
  longlong unpackedSampleDataSize;
  longlong packedSampleDataSize;
  longlong packedOffsetTableSize;
  reference pvStack_198;
  int lineNo;
  uchar *dataPtr;
  int y_4;
  int y_3;
  int y_2;
  int c;
  longlong offset;
  int y_1;
  vector<long_long,_std::allocator<long_long>_> offsets;
  int numBlocks;
  vector<float,_std::allocator<float>_> image;
  int dataHeight;
  int dataWidth;
  int h;
  int w;
  int y;
  int x;
  char *marker_next;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string attrType;
  string attrName;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  channels;
  uint local_a0;
  int numChannels;
  int compressionType;
  int numScanlineBlocks;
  int dh;
  int dw;
  int dy;
  int dx;
  unsigned_long_long *puStack_80;
  char header [4];
  char *marker;
  char *head;
  size_t ret;
  allocator_type local_51;
  undefined1 local_50 [8];
  vector<char,_std::allocator<char>_> buf;
  size_t filesize;
  FILE *fp;
  char **err_local;
  char *filename_local;
  DeepImage *deepImage_local;
  
  if (deepImage == (DeepImage *)0x0) {
    if (err != (char **)0x0) {
      *err = "Invalid argument.";
    }
    deepImage_local._4_4_ = -1;
  }
  else {
    __stream = fopen(filename,"rb");
    if (__stream == (FILE *)0x0) {
      if (err != (char **)0x0) {
        *err = "Cannot read file.";
      }
      deepImage_local._4_4_ = -1;
    }
    else {
      fseek(__stream,0,2);
      buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = ftell(__stream);
      fseek(__stream,0,0);
      __n_00 = buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_;
      if (buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ == 0) {
        fclose(__stream);
        if (err != (char **)0x0) {
          *err = "File size is zero.";
        }
        deepImage_local._4_4_ = -1;
      }
      else {
        std::allocator<char>::allocator();
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)local_50,__n_00,&local_51);
        std::allocator<char>::~allocator(&local_51);
        pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)local_50,0);
        sVar7 = fread(pvVar6,1,buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_,
                      __stream);
        if (sVar7 != buf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_) {
          __assert_fail("ret == filesize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                        ,0x27eb,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
        }
        fclose(__stream);
        pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)local_50,0);
        puVar8 = (unsigned_long_long *)
                 std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)local_50,0);
        dx = 0x1312f76;
        if ((int)*puVar8 == 0x1312f76) {
          puStack_80 = (unsigned_long_long *)((long)puVar8 + 4);
          if ((((*(char *)puStack_80 == '\x02') && (*(char *)((long)puVar8 + 5) == '\b')) &&
              (*(char *)((long)puVar8 + 6) == '\0')) && (*(char *)((long)puVar8 + 7) == '\0')) {
            puStack_80 = puVar8 + 1;
            dw = -1;
            dh = -1;
            numScanlineBlocks = -1;
            compressionType = -1;
            numChannels = 1;
            local_a0 = 0xffffffff;
            channels.
            super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = -1;
            std::
            vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
            ::vector((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                      *)((long)&attrName.field_2 + 8));
            do {
              std::__cxx11::string::string((string *)(attrType.field_2._M_local_buf + 8));
              ty = &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::string((string *)ty);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&marker_next);
              _y = (unsigned_long_long *)
                   anon_unknown.dwarf_49742::ReadAttribute
                             ((string *)(attrType.field_2._M_local_buf + 8),(string *)ty,
                              (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&marker_next,
                              (char *)puStack_80);
              if (_y == (unsigned_long_long *)0x0) {
                puStack_80 = (unsigned_long_long *)((long)puStack_80 + 1);
                dy = 2;
              }
              else {
                iVar4 = std::__cxx11::string::compare(attrType.field_2._M_local_buf + 8);
                if (iVar4 == 0) {
                  pbVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &marker_next,0);
                  if (3 < *pbVar9) {
                    if (err != (char **)0x0) {
                      *err = "Unsupported compression type.";
                    }
                    deepImage_local._4_4_ = -5;
                    dy = 1;
                    goto LAB_0019b315;
                  }
                  pbVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &marker_next,0);
                  local_a0 = (uint)*pbVar9;
                  if (local_a0 == 3) {
                    numChannels = 0x10;
                  }
                }
                else {
                  iVar4 = std::__cxx11::string::compare(attrType.field_2._M_local_buf + 8);
                  if (iVar4 == 0) {
                    anon_unknown.dwarf_49742::ReadChannelInfo
                              ((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                *)((long)&attrName.field_2 + 8),
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&marker_next
                              );
                    sVar10 = std::
                             vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                             ::size((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                     *)((long)&attrName.field_2 + 8));
                    channels.
                    super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (int)sVar10;
                    if (channels.
                        super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 1) {
                      if (err != (char **)0x0) {
                        *err = "Invalid channels format.";
                      }
                      deepImage_local._4_4_ = -6;
                      dy = 1;
                      goto LAB_0019b315;
                    }
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare(attrType.field_2._M_local_buf + 8);
                    if (iVar4 == 0) {
                      piVar14 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                       at((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          &marker_next,0);
                      dw = *piVar14;
                      piVar14 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                       at((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          &marker_next,4);
                      dh = *piVar14;
                      piVar14 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                       at((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          &marker_next,8);
                      numScanlineBlocks = *piVar14;
                      piVar14 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                       at((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          &marker_next,0xc);
                      compressionType = *piVar14;
                      bVar3 = anon_unknown.dwarf_49742::IsBigEndian();
                      if (bVar3) {
                        anon_unknown.dwarf_49742::swap4((uint *)&dw);
                        anon_unknown.dwarf_49742::swap4((uint *)&dh);
                        anon_unknown.dwarf_49742::swap4((uint *)&numScanlineBlocks);
                        anon_unknown.dwarf_49742::swap4((uint *)&compressionType);
                      }
                    }
                    else {
                      iVar4 = std::__cxx11::string::compare(attrType.field_2._M_local_buf + 8);
                      if (iVar4 == 0) {
                        piVar14 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>
                                         ::at((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                               *)&marker_next,0);
                        w = *piVar14;
                        piVar14 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>
                                         ::at((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                               *)&marker_next,4);
                        h = *piVar14;
                        piVar14 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>
                                         ::at((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                               *)&marker_next,8);
                        dataWidth = *piVar14;
                        piVar14 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>
                                         ::at((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                               *)&marker_next,0xc);
                        dataHeight = *piVar14;
                        bVar3 = anon_unknown.dwarf_49742::IsBigEndian();
                        if (bVar3) {
                          anon_unknown.dwarf_49742::swap4((uint *)&w);
                          anon_unknown.dwarf_49742::swap4((uint *)&h);
                          anon_unknown.dwarf_49742::swap4((uint *)&dataWidth);
                          anon_unknown.dwarf_49742::swap4((uint *)&dataHeight);
                        }
                      }
                    }
                  }
                }
                puStack_80 = _y;
                dy = 0;
              }
LAB_0019b315:
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&marker_next);
              std::__cxx11::string::~string
                        ((string *)
                         &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              std::__cxx11::string::~string((string *)(attrType.field_2._M_local_buf + 8));
            } while (dy == 0);
            if (dy == 2) {
              if (dw < 0) {
                __assert_fail("dx >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                              ,0x2865,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
              }
              if (dh < 0) {
                __assert_fail("dy >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                              ,0x2866,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
              }
              if (numScanlineBlocks < 0) {
                __assert_fail("dw >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                              ,0x2867,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
              }
              if (compressionType < 0) {
                __assert_fail("dh >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                              ,0x2868,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
              }
              if (channels.
                  super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 1) {
                __assert_fail("numChannels >= 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                              ,0x2869,"int LoadDeepEXR(DeepImage *, const char *, const char **)");
              }
              image.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ = (numScanlineBlocks - dw) + 1;
              image.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_4_ = (compressionType - dh) + 1;
              iVar4 = image.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_ *
                      (int)image.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
              this = (allocator<float> *)
                     ((long)&offsets.super__Vector_base<long_long,_std::allocator<long_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
              std::allocator<float>::allocator(this);
              std::vector<float,_std::allocator<float>_>::vector
                        ((vector<float,_std::allocator<float>_> *)&numBlocks,(long)(iVar4 * 4),this)
              ;
              std::allocator<float>::~allocator
                        ((allocator<float> *)
                         ((long)&offsets.super__Vector_base<long_long,_std::allocator<long_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_4_ =
                   (int)image.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage / numChannels;
              if ((int)offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage * numChannels <
                  (int)image.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage) {
                offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_ =
                     (int)offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1;
              }
              sVar10 = (size_type)
                       (int)offsets.super__Vector_base<long_long,_std::allocator<long_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage;
              std::allocator<long_long>::allocator((allocator<long_long> *)((long)&offset + 7));
              std::vector<long_long,_std::allocator<long_long>_>::vector
                        ((vector<long_long,_std::allocator<long_long>_> *)&y_1,sVar10,
                         (allocator<long_long> *)((long)&offset + 7));
              std::allocator<long_long>::~allocator((allocator<long_long> *)((long)&offset + 7));
              for (offset._0_4_ = 0;
                  (int)offset <
                  (int)offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage; offset._0_4_ = (int)offset + 1) {
                _y_2 = *puStack_80;
                bVar3 = anon_unknown.dwarf_49742::IsBigEndian();
                if (bVar3) {
                  anon_unknown.dwarf_49742::swap8((unsigned_long_long *)&y_2);
                }
                uVar2 = _y_2;
                puStack_80 = puStack_80 + 1;
                puVar8 = (unsigned_long_long *)
                         std::vector<long_long,_std::allocator<long_long>_>::operator[]
                                   ((vector<long_long,_std::allocator<long_long>_> *)&y_1,
                                    (long)(int)offset);
                *puVar8 = uVar2;
              }
              if (((local_a0 == 0) || (local_a0 == 2)) || (local_a0 == 3)) {
                pppfVar11 = (float ***)
                            malloc((long)channels.
                                         super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ <<
                                   3);
                deepImage->image = pppfVar11;
                for (y_3 = 0; y_3 < channels.
                                    super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
                    y_3 = y_3 + 1) {
                  ppfVar12 = (float **)
                             malloc((long)(int)image.
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_end_of_storage <<
                                    3);
                  deepImage->image[y_3] = ppfVar12;
                  for (y_4 = 0; y_4 < (int)image.super__Vector_base<float,_std::allocator<float>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage;
                      y_4 = y_4 + 1) {
                  }
                }
                ppiVar13 = (int **)malloc((long)(int)image.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                          << 3);
                deepImage->offset_table = ppiVar13;
                for (dataPtr._4_4_ = 0;
                    dataPtr._4_4_ <
                    (int)image.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
                    dataPtr._4_4_ = dataPtr._4_4_ + 1) {
                  piVar14 = (int *)malloc((long)image.
                                                super__Vector_base<float,_std::allocator<float>_>.
                                                _M_impl.super__Vector_impl_data._M_end_of_storage.
                                                _4_4_ << 2);
                  deepImage->offset_table[dataPtr._4_4_] = piVar14;
                }
                for (dataPtr._0_4_ = 0;
                    (int)dataPtr <
                    (int)offsets.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage; dataPtr._0_4_ = (int)dataPtr + 1
                    ) {
                  pvVar15 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                                      ((vector<long_long,_std::allocator<long_long>_> *)&y_1,
                                       (long)(int)dataPtr);
                  pvStack_198 = pvVar6 + *pvVar15;
                  packedOffsetTableSize._4_4_ = *(undefined4 *)pvStack_198;
                  packedSampleDataSize = *(longlong *)(pvStack_198 + 4);
                  unpackedSampleDataSize = *(longlong *)(pvStack_198 + 0xc);
                  pixelOffsetTable.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = *(pointer *)(pvStack_198 + 0x14);
                  bVar3 = anon_unknown.dwarf_49742::IsBigEndian();
                  if (bVar3) {
                    anon_unknown.dwarf_49742::swap4((uint *)((long)&packedOffsetTableSize + 4));
                    anon_unknown.dwarf_49742::swap8((unsigned_long_long *)&packedSampleDataSize);
                    anon_unknown.dwarf_49742::swap8((unsigned_long_long *)&unpackedSampleDataSize);
                    anon_unknown.dwarf_49742::swap8
                              ((unsigned_long_long *)
                               &pixelOffsetTable.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
                  }
                  sVar10 = (size_type)
                           image.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._4_4_;
                  std::allocator<int>::allocator((allocator<int> *)((long)&dstLen + 7));
                  std::vector<int,_std::allocator<int>_>::vector
                            ((vector<int,_std::allocator<int>_> *)local_1d0,sVar10,
                             (allocator<int> *)((long)&dstLen + 7));
                  std::allocator<int>::~allocator((allocator<int> *)((long)&dstLen + 7));
                  sVar10 = std::vector<int,_std::allocator<int>_>::size
                                     ((vector<int,_std::allocator<int>_> *)local_1d0);
                  uStack_1e0 = sVar10 << 2;
                  pvVar16 = std::vector<int,_std::allocator<int>_>::at
                                      ((vector<int,_std::allocator<int>_> *)local_1d0,0);
                  anon_unknown.dwarf_49742::DecompressZip
                            ((uchar *)pvVar16,&stack0xfffffffffffffe20,(uchar *)(pvStack_198 + 0x1c)
                             ,packedSampleDataSize);
                  uVar1 = uStack_1e0;
                  sVar10 = std::vector<int,_std::allocator<int>_>::size
                                     ((vector<int,_std::allocator<int>_> *)local_1d0);
                  if (uVar1 != sVar10 << 2) {
                    __assert_fail("dstLen == pixelOffsetTable.size() * sizeof(int)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                                  ,0x28b7,
                                  "int LoadDeepEXR(DeepImage *, const char *, const char **)");
                  }
                  for (sampleData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                      __n = pixelOffsetTable.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,
                      sampleData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ <
                      image.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_;
                      sampleData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                           sampleData.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
                    pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                                        ((vector<int,_std::allocator<int>_> *)local_1d0,
                                         (long)sampleData.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                               _4_4_);
                    deepImage->offset_table[(int)dataPtr]
                    [sampleData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_] = *pvVar16;
                  }
                  std::allocator<unsigned_char>::allocator
                            ((allocator<unsigned_char> *)((long)&dstLen_1 + 7));
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_200,
                             (size_type)__n,(allocator<unsigned_char> *)((long)&dstLen_1 + 7));
                  std::allocator<unsigned_char>::~allocator
                            ((allocator<unsigned_char> *)((long)&dstLen_1 + 7));
                  piStack_210 = pixelOffsetTable.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage;
                  pvVar17 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       local_200,0);
                  anon_unknown.dwarf_49742::DecompressZip
                            (pvVar17,(unsigned_long *)&stack0xfffffffffffffdf0,
                             (uchar *)(pvStack_198 + packedSampleDataSize + 0x1c),
                             unpackedSampleDataSize);
                  if (piStack_210 !=
                      pixelOffsetTable.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    __assert_fail("dstLen == (unsigned long)unpackedSampleDataSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                                  ,0x28c5,
                                  "int LoadDeepEXR(DeepImage *, const char *, const char **)");
                  }
                  channelOffsetList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_ = 0xffffffff;
                  std::allocator<int>::allocator((allocator<int> *)((long)&i_1 + 3));
                  std::vector<int,_std::allocator<int>_>::vector
                            ((vector<int,_std::allocator<int>_> *)&channelOffset,
                             (long)channels.
                                   super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                             (allocator<int> *)((long)&i_1 + 3));
                  std::allocator<int>::~allocator((allocator<int> *)((long)&i_1 + 3));
                  samplesPerLine = 0;
                  for (dataOffset._4_4_ = 0;
                      dataOffset._4_4_ <
                      channels.
                      super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
                      dataOffset._4_4_ = dataOffset._4_4_ + 1) {
                    pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                                        ((vector<int,_std::allocator<int>_> *)&channelOffset,
                                         (long)dataOffset._4_4_);
                    *pvVar16 = samplesPerLine;
                    pvVar18 = std::
                              vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                              ::operator[]((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                            *)((long)&attrName.field_2 + 8),(long)dataOffset._4_4_);
                    if (pvVar18->pixelType == 0) {
                      samplesPerLine = samplesPerLine + 4;
                    }
                    else {
                      pvVar18 = std::
                                vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                ::operator[]((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                              *)((long)&attrName.field_2 + 8),(long)dataOffset._4_4_
                                            );
                      if (pvVar18->pixelType == 1) {
                        samplesPerLine = samplesPerLine + 2;
                      }
                      else {
                        pvVar18 = std::
                                  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                  ::operator[]((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                                *)((long)&attrName.field_2 + 8),
                                               (long)dataOffset._4_4_);
                        if (pvVar18->pixelType != 2) {
                          __assert_fail("0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                                        ,0x28d6,
                                        "int LoadDeepEXR(DeepImage *, const char *, const char **)")
                          ;
                        }
                        samplesPerLine = samplesPerLine + 4;
                      }
                    }
                  }
                  channelOffsetList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_ = samplesPerLine;
                  if (samplesPerLine < 2) {
                    __assert_fail("sampleSize >= 2",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                                  ,0x28db,
                                  "int LoadDeepEXR(DeepImage *, const char *, const char **)");
                  }
                  pvVar16 = std::vector<int,_std::allocator<int>_>::operator[]
                                      ((vector<int,_std::allocator<int>_> *)local_1d0,
                                       (long)(image.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage.
                                              _4_4_ + -1));
                  iVar4 = *pvVar16 *
                          channelOffsetList.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_4_;
                  sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      local_200);
                  if ((long)iVar4 != sVar10) {
                    __assert_fail("(size_t)(pixelOffsetTable[dataWidth - 1] * sampleSize) == sampleData.size()"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                                  ,0x28dd,
                                  "int LoadDeepEXR(DeepImage *, const char *, const char **)");
                  }
                  sVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      local_200);
                  iVar4 = (int)(sVar10 / (ulong)(long)channelOffsetList.
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data.
                                                      _M_end_of_storage._4_4_);
                  _x_1 = 0;
                  for (ui = 0; (int)ui < channels.
                                         super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
                      ui = ui + 1) {
                    pfVar19 = (float *)malloc((long)iVar4 << 2);
                    deepImage->image[(int)ui][(int)dataPtr] = pfVar19;
                    pvVar18 = std::
                              vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                              ::operator[]((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                            *)((long)&attrName.field_2 + 8),(long)(int)ui);
                    if (pvVar18->pixelType == 0) {
                      for (x_2 = 0; x_2 < iVar4; x_2 = x_2 + 1) {
                        puVar20 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>
                                          ::at((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)local_200,_x_1 + (long)x_2 * 4);
                        deepImage->image[(int)ui][(int)dataPtr][x_2] = (float)*puVar20;
                      }
                      lVar21 = (long)iVar4 * 4;
                    }
                    else {
                      pvVar18 = std::
                                vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                ::operator[]((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                              *)((long)&attrName.field_2 + 8),(long)(int)ui);
                      if (pvVar18->pixelType == 1) {
                        for (f32.u = 0; (int)f32.u < iVar4; f32.u = f32.u + 1) {
                          pvVar17 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                              ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)local_200,_x_1 + (long)(int)f32.u * 2);
                          local_25c.u = *(undefined2 *)pvVar17;
                          FVar5 = anon_unknown.dwarf_49742::half_to_float(local_25c);
                          *(FP32 *)(deepImage->image[(int)ui][(int)dataPtr] + (int)f32.u) = FVar5;
                        }
                        lVar21 = (long)iVar4 * 2;
                      }
                      else {
                        for (c_2 = 0; c_2 < iVar4; c_2 = c_2 + 1) {
                          pfVar19 = (float *)std::
                                             vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                             at((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                 *)local_200,_x_1 + (long)c_2 * 4);
                          deepImage->image[(int)ui][(int)dataPtr][c_2] = *pfVar19;
                        }
                        lVar21 = (long)iVar4 * 4;
                      }
                    }
                    _x_1 = lVar21 + _x_1;
                  }
                  std::vector<int,_std::allocator<int>_>::~vector
                            ((vector<int,_std::allocator<int>_> *)&channelOffset);
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_200);
                  std::vector<int,_std::allocator<int>_>::~vector
                            ((vector<int,_std::allocator<int>_> *)local_1d0);
                }
                deepImage->width =
                     image.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_;
                deepImage->height =
                     (int)image.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
                ppcVar22 = (char **)malloc((long)channels.
                                                 super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                                 _4_4_ << 3);
                deepImage->channel_names = ppcVar22;
                for (local_270 = 0;
                    local_270 <
                    channels.
                    super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
                    local_270 = local_270 + 1) {
                  std::
                  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                  ::operator[]((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                *)((long)&attrName.field_2 + 8),(long)local_270);
                  pcVar23 = (char *)std::__cxx11::string::c_str();
                  pcVar23 = strdup(pcVar23);
                  deepImage->channel_names[local_270] = pcVar23;
                }
                deepImage->num_channels =
                     channels.
                     super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
                deepImage_local._4_4_ = 0;
              }
              else {
                if (err != (char **)0x0) {
                  *err = "Unsupported format.";
                }
                deepImage_local._4_4_ = -10;
              }
              dy = 1;
              std::vector<long_long,_std::allocator<long_long>_>::~vector
                        ((vector<long_long,_std::allocator<long_long>_> *)&y_1);
              std::vector<float,_std::allocator<float>_>::~vector
                        ((vector<float,_std::allocator<float>_> *)&numBlocks);
            }
            std::
            vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
            ::~vector((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                       *)((long)&attrName.field_2 + 8));
          }
          else {
            if (err != (char **)0x0) {
              *err = "Unsupported version or scanline.";
            }
            deepImage_local._4_4_ = -4;
            dy = 1;
          }
        }
        else {
          if (err != (char **)0x0) {
            *err = "Header mismatch.";
          }
          deepImage_local._4_4_ = -3;
          dy = 1;
          puStack_80 = puVar8;
        }
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)local_50);
      }
    }
  }
  return deepImage_local._4_4_;
}

Assistant:

int LoadDeepEXR(DeepImage *deepImage, const char *filename, const char **err) {
  if (deepImage == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return -1;
  }

  FILE *fp = fopen(filename, "rb");
  if (!fp) {
    if (err) {
      (*err) = "Cannot read file.";
    }
    return -1;
  }

  size_t filesize;
  // Compute size
  fseek(fp, 0, SEEK_END);
  filesize = ftell(fp);
  fseek(fp, 0, SEEK_SET);

  if (filesize == 0) {
    fclose(fp);
    if (err) {
      (*err) = "File size is zero.";
    }
    return -1;
  }

  std::vector<char> buf(filesize); // @todo { use mmap }
  {
    size_t ret;
    ret = fread(&buf[0], 1, filesize, fp);
    assert(ret == filesize);
    (void)ret;
  }
  fclose(fp);

  const char *head = &buf[0];
  const char *marker = &buf[0];

  // Header check.
  {
    const char header[] = {0x76, 0x2f, 0x31, 0x01};

    if (memcmp(marker, header, 4) != 0) {
      if (err) {
        (*err) = "Header mismatch.";
      }
      return -3;
    }
    marker += 4;
  }

  // Version, scanline.
  {
    // ver 2.0, scanline, deep bit on(0x800)
    // must be [2, 0, 0, 0]
    if (marker[0] != 2 || marker[1] != 8 || marker[2] != 0 || marker[3] != 0) {
      if (err) {
        (*err) = "Unsupported version or scanline.";
      }
      return -4;
    }

    marker += 4;
  }

  int dx = -1;
  int dy = -1;
  int dw = -1;
  int dh = -1;
  int numScanlineBlocks = 1; // 16 for ZIP compression.
  int compressionType = -1;
  int numChannels = -1;
  std::vector<ChannelInfo> channels;

  // Read attributes
  for (;;) {
    std::string attrName;
    std::string attrType;
    std::vector<unsigned char> data;
    const char *marker_next = ReadAttribute(attrName, attrType, data, marker);
    if (marker_next == NULL) {
      marker++; // skip '\0'
      break;
    }

    if (attrName.compare("compression") == 0) {
      // must be 0:No compression, 1: RLE, 2: ZIPs or 3: ZIP
      if (data[0] > 3) {
        if (err) {
          (*err) = "Unsupported compression type.";
        }
        return -5;
      }

      compressionType = data[0];

      if (compressionType == 3) { // ZIP
        numScanlineBlocks = 16;
      }

    } else if (attrName.compare("channels") == 0) {

      // name: zero-terminated string, from 1 to 255 bytes long
      // pixel type: int, possible values are: UINT = 0 HALF = 1 FLOAT = 2
      // pLinear: unsigned char, possible values are 0 and 1
      // reserved: three chars, should be zero
      // xSampling: int
      // ySampling: int

      ReadChannelInfo(channels, data);

      numChannels = channels.size();

      if (numChannels < 1) {
        if (err) {
          (*err) = "Invalid channels format.";
        }
        return -6;
      }

    } else if (attrName.compare("dataWindow") == 0) {
      memcpy(&dx, &data.at(0), sizeof(int));
      memcpy(&dy, &data.at(4), sizeof(int));
      memcpy(&dw, &data.at(8), sizeof(int));
      memcpy(&dh, &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&dx));
        swap4(reinterpret_cast<unsigned int *>(&dy));
        swap4(reinterpret_cast<unsigned int *>(&dw));
        swap4(reinterpret_cast<unsigned int *>(&dh));
      }

    } else if (attrName.compare("displayWindow") == 0) {
      int x;
      int y;
      int w;
      int h;
      memcpy(&x, &data.at(0), sizeof(int));
      memcpy(&y, &data.at(4), sizeof(int));
      memcpy(&w, &data.at(8), sizeof(int));
      memcpy(&h, &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&x));
        swap4(reinterpret_cast<unsigned int *>(&y));
        swap4(reinterpret_cast<unsigned int *>(&w));
        swap4(reinterpret_cast<unsigned int *>(&h));
      }
    }

    marker = marker_next;
  }

  assert(dx >= 0);
  assert(dy >= 0);
  assert(dw >= 0);
  assert(dh >= 0);
  assert(numChannels >= 1);

  int dataWidth = dw - dx + 1;
  int dataHeight = dh - dy + 1;

  std::vector<float> image(dataWidth * dataHeight * 4); // 4 = RGBA

  // Read offset tables.
  int numBlocks = dataHeight / numScanlineBlocks;
  if (numBlocks * numScanlineBlocks < dataHeight) {
    numBlocks++;
  }

  std::vector<long long> offsets(numBlocks);

  for (int y = 0; y < numBlocks; y++) {
    long long offset;
    memcpy(&offset, marker, sizeof(long long));
    if (IsBigEndian()) {
      swap8(reinterpret_cast<unsigned long long *>(&offset));
    }
    marker += sizeof(long long); // = 8
    offsets[y] = offset;
  }

  if (compressionType != 0 && compressionType != 2 && compressionType != 3) {
    if (err) {
      (*err) = "Unsupported format.";
    }
    return -10;
  }

  deepImage->image = (float ***)malloc(sizeof(float **) * numChannels);
  for (int c = 0; c < numChannels; c++) {
    deepImage->image[c] = (float **)malloc(sizeof(float *) * dataHeight);
    for (int y = 0; y < dataHeight; y++) {
    }
  }

  deepImage->offset_table = (int **)malloc(sizeof(int *) * dataHeight);
  for (int y = 0; y < dataHeight; y++) {
    deepImage->offset_table[y] = (int *)malloc(sizeof(int) * dataWidth);
  }

  for (int y = 0; y < numBlocks; y++) {
    const unsigned char *dataPtr =
        reinterpret_cast<const unsigned char *>(head + offsets[y]);

    // int: y coordinate
    // int64: packed size of pixel offset table
    // int64: packed size of sample data
    // int64: unpacked size of sample data
    // compressed pixel offset table
    // compressed sample data
    int lineNo;
    long long packedOffsetTableSize;
    long long packedSampleDataSize;
    long long unpackedSampleDataSize;
    memcpy(&lineNo, dataPtr, sizeof(int));
    memcpy(&packedOffsetTableSize, dataPtr + 4, sizeof(long long));
    memcpy(&packedSampleDataSize, dataPtr + 12, sizeof(long long));
    memcpy(&unpackedSampleDataSize, dataPtr + 20, sizeof(long long));

    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&lineNo));
      swap8(reinterpret_cast<unsigned long long *>(&packedOffsetTableSize));
      swap8(reinterpret_cast<unsigned long long *>(&packedSampleDataSize));
      swap8(reinterpret_cast<unsigned long long *>(&unpackedSampleDataSize));
    }

    std::vector<int> pixelOffsetTable(dataWidth);

    // decode pixel offset table.
    {
      unsigned long dstLen = pixelOffsetTable.size() * sizeof(int);
      DecompressZip(reinterpret_cast<unsigned char *>(&pixelOffsetTable.at(0)),
                    dstLen, dataPtr + 28, packedOffsetTableSize);

      assert(dstLen == pixelOffsetTable.size() * sizeof(int));
      for (int i = 0; i < dataWidth; i++) {
        deepImage->offset_table[y][i] = pixelOffsetTable[i];
      }
    }

    std::vector<unsigned char> sampleData(unpackedSampleDataSize);

    // decode sample data.
    {
      unsigned long dstLen = unpackedSampleDataSize;
      DecompressZip(reinterpret_cast<unsigned char *>(&sampleData.at(0)),
                    dstLen, dataPtr + 28 + packedOffsetTableSize,
                    packedSampleDataSize);
      assert(dstLen == (unsigned long)unpackedSampleDataSize);
    }

    // decode sample
    int sampleSize = -1;
    std::vector<int> channelOffsetList(numChannels);
    {
      int channelOffset = 0;
      for (int i = 0; i < numChannels; i++) {
        channelOffsetList[i] = channelOffset;
        if (channels[i].pixelType == TINYEXR_PIXELTYPE_UINT) { // UINT
          channelOffset += 4;
        } else if (channels[i].pixelType == TINYEXR_PIXELTYPE_HALF) { // half
          channelOffset += 2;
        } else if (channels[i].pixelType == TINYEXR_PIXELTYPE_FLOAT) { // float
          channelOffset += 4;
        } else {
          assert(0);
        }
      }
      sampleSize = channelOffset;
    }
    assert(sampleSize >= 2);

    assert((size_t)(pixelOffsetTable[dataWidth - 1] * sampleSize) == sampleData.size());
    int samplesPerLine = sampleData.size() / sampleSize;

    //
    // Alloc memory
    //

    //
    // pixel data is stored as image[channels][pixel_samples]
    //
    {
      unsigned long long dataOffset = 0;
      for (int c = 0; c < numChannels; c++) {

        deepImage->image[c][y] =
            (float *)malloc(sizeof(float) * samplesPerLine);

        if (channels[c].pixelType == 0) { // UINT
          for (int x = 0; x < samplesPerLine; x++) {
            unsigned int ui = *reinterpret_cast<unsigned int *>(
                                  &sampleData.at(dataOffset + x * sizeof(int)));
            deepImage->image[c][y][x] = (float)ui; // @fixme
          }
          dataOffset += sizeof(unsigned int) * samplesPerLine;
        } else if (channels[c].pixelType == 1) { // half
          for (int x = 0; x < samplesPerLine; x++) {
            FP16 f16;
            f16.u = *reinterpret_cast<unsigned short *>(
                        &sampleData.at(dataOffset + x * sizeof(short)));
            FP32 f32 = half_to_float(f16);
            deepImage->image[c][y][x] = f32.f;
          }
          dataOffset += sizeof(short) * samplesPerLine;
        } else { // float
          for (int x = 0; x < samplesPerLine; x++) {
            float f = *reinterpret_cast<float *>(
                          &sampleData.at(dataOffset + x * sizeof(float)));
            deepImage->image[c][y][x] = f;
          }
          dataOffset += sizeof(float) * samplesPerLine;
        }
      }
    }

  } // y

  deepImage->width = dataWidth;
  deepImage->height = dataHeight;

  deepImage->channel_names =
      (const char **)malloc(sizeof(const char *) * numChannels);
  for (int c = 0; c < numChannels; c++) {
#ifdef _WIN32
    deepImage->channel_names[c] = _strdup(channels[c].name.c_str());
#else
    deepImage->channel_names[c] = strdup(channels[c].name.c_str());
#endif
  }
  deepImage->num_channels = numChannels;

  return 0; // OK
}